

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O2

void Fx_ManStop(Fx_Man_t *p)

{
  Hsh_VecMan_t *__ptr;
  Vec_Flt_t *__ptr_00;
  Vec_Que_t *__ptr_01;
  
  Vec_WecFree(p->vLits);
  Vec_IntFree(p->vCounts);
  __ptr = p->pHash;
  Vec_IntFree(__ptr->vTable);
  Vec_IntFree(__ptr->vData);
  Vec_IntFree(__ptr->vMap);
  free(__ptr);
  __ptr_00 = p->vWeights;
  free(__ptr_00->pArray);
  free(__ptr_00);
  __ptr_01 = p->vPrio;
  if (__ptr_01->pOrder != (int *)0x0) {
    free(__ptr_01->pOrder);
    __ptr_01->pOrder = (int *)0x0;
  }
  free(__ptr_01->pHeap);
  free(__ptr_01);
  Vec_IntFree(p->vVarCube);
  Vec_IntFree(p->vLevels);
  Vec_IntFree(p->vCubesS);
  Vec_IntFree(p->vCubesD);
  Vec_IntFree(p->vCompls);
  Vec_IntFree(p->vCubeFree);
  Vec_IntFree(p->vDiv);
  free(p);
  return;
}

Assistant:

void Fx_ManStop( Fx_Man_t * p )
{
//    Vec_WecFree( p->vCubes );
    Vec_WecFree( p->vLits );
    Vec_IntFree( p->vCounts );
    Hsh_VecManStop( p->pHash );
    Vec_FltFree( p->vWeights );
    Vec_QueFree( p->vPrio );
    Vec_IntFree( p->vVarCube );
    Vec_IntFree( p->vLevels );
    // temporary data
    Vec_IntFree( p->vCubesS );
    Vec_IntFree( p->vCubesD );
    Vec_IntFree( p->vCompls );
    Vec_IntFree( p->vCubeFree );
    Vec_IntFree( p->vDiv );
    ABC_FREE( p );
}